

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O1

SquareMatrix<std::complex<double>_> qclab::dense::eye<std::complex<double>>(int64_t size)

{
  long lVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  __uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_> _Var2;
  int64_t in_RSI;
  SquareMatrix<std::complex<double>_> SVar3;
  complex<double> value;
  __uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
  extraout_RDX;
  
  value._M_value._8_8_ = in_RCX;
  value._M_value._0_8_ = in_RDX;
  SquareMatrix<std::complex<double>_>::SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)size,in_RSI,value);
  _Var2._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
       (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
       extraout_RDX.
       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>.
       _M_t.
       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
       super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  if (0 < in_RSI) {
    lVar1 = 0;
    do {
      _Var2._M_t.
      super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
      super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
           (tuple<std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>)
           (*(long *)size * lVar1 * 0x10 + *(long *)(size + 8));
      *(undefined8 *)
       (lVar1 * 0x10 +
       (long)_Var2._M_t.
             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl) =
           0x3ff0000000000000;
      *(undefined8 *)
       (lVar1 * 0x10 + 8 +
       (long)_Var2._M_t.
             super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
             .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl) = 0;
      lVar1 = lVar1 + 1;
    } while (in_RSI != lVar1);
  }
  SVar3.data_._M_t.
  super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>.
  super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
        )(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
          )_Var2._M_t.
           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
           .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
  SVar3.size_ = size;
  return SVar3;
}

Assistant:

SquareMatrix< T > eye( const int64_t size ) {
      SquareMatrix< T > mat( size , T(0) ) ;
      #pragma omp parallel for
      for ( int64_t i = 0; i < size; i++ ) {
        mat(i,i) = T(1) ;
      }
      return mat ;
    }